

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isBilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths,Vec2 *xBounds,
               Vec2 *yBounds,float cmpReference,float result,bool isFixedPointDepth)

{
  float y;
  int iVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  uint uVar6;
  deUint32 comb;
  uint val;
  byte bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  BVec4 cmpTrue;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vec4 refVal;
  
  iVar1 = prec->pcfBits;
  fVar15 = depths->m_data[1];
  fVar16 = depths->m_data[2];
  fVar17 = depths->m_data[3];
  CVar2 = execCompare(compareMode,depths->m_data[0],cmpReference,prec->referenceBits,
                      isFixedPointDepth);
  CVar3 = execCompare(compareMode,fVar15,cmpReference,prec->referenceBits,isFixedPointDepth);
  CVar4 = execCompare(compareMode,fVar16,cmpReference,prec->referenceBits,isFixedPointDepth);
  CVar5 = execCompare(compareMode,fVar17,cmpReference,prec->referenceBits,isFixedPointDepth);
  if (iVar1 < 1) {
    fVar15 = 1.0;
    if (((((ushort)CVar2 & 1) == 0) && (((ushort)CVar3 & 1) == 0)) && (((ushort)CVar4 & 1) == 0)) {
      if (((ushort)CVar5 & 1) == 0) {
        fVar15 = 0.0;
      }
      else {
        fVar15 = 1.0;
      }
    }
    fVar16 = 0.0;
    if ((((ushort)((ushort)CVar4 | (ushort)CVar3 | (ushort)CVar2) >> 8 & 1) == 0) &&
       (((ushort)CVar5 >> 8 & 1) == 0)) {
      fVar16 = 1.0;
    }
    fVar17 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    bVar7 = -(result <= fVar15 + fVar17) & -(fVar16 - fVar17 <= result);
  }
  else {
    fVar15 = xBounds->m_data[0];
    fVar16 = xBounds->m_data[1];
    fVar17 = yBounds->m_data[0];
    y = yBounds->m_data[1];
    fVar9 = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
    fVar10 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    uVar6 = 0xffffffff;
    for (val = 0; val != 0x10; val = val + 1) {
      if ((uVar6 & ((ushort)CVar5 >> 5 & 8 |
                   (ushort)CVar4 >> 6 & 4 | (ushort)CVar3 >> 7 & 2 | CVar2.isFalse & 1) |
          val & ((ushort)CVar2 & 1) + ((ushort)CVar3 & 1) * 2 + ((ushort)CVar4 & 1) * 4 +
                ((ushort)CVar5 & 1) * 8) == 0xf) {
        extractBVec4(val,0);
        Vector<float,_4>::Vector(&local_50,1.0);
        Vector<float,_4>::Vector(&local_60,0.0);
        select<float,4>((tcu *)&refVal,&local_50,&local_60,&cmpTrue);
        fVar11 = bilinearInterpolate(&refVal,fVar15,fVar17);
        fVar12 = bilinearInterpolate(&refVal,fVar16,fVar17);
        fVar13 = bilinearInterpolate(&refVal,fVar15,y);
        fVar14 = bilinearInterpolate(&refVal,fVar16,y);
        fVar18 = (float)(~-(uint)(fVar13 <= fVar14) & (uint)fVar14 |
                        -(uint)(fVar13 <= fVar14) & (uint)fVar13);
        uVar8 = -(uint)(fVar12 <= fVar18);
        fVar18 = (float)(uVar8 & (uint)fVar12 | ~uVar8 & (uint)fVar18);
        uVar8 = -(uint)(fVar11 <= fVar18);
        if ((float)(uVar8 & (uint)fVar11 | ~uVar8 & (uint)fVar18) - (fVar10 + fVar9) <= result) {
          fVar13 = (float)(~-(uint)(fVar14 <= fVar13) & (uint)fVar14 |
                          (uint)fVar13 & -(uint)(fVar14 <= fVar13));
          uVar8 = -(uint)(fVar13 <= fVar12);
          fVar12 = (float)(uVar8 & (uint)fVar12 | ~uVar8 & (uint)fVar13);
          uVar8 = -(uint)(fVar12 <= fVar11);
          if (result <= (float)(uVar8 & (uint)fVar11 | ~uVar8 & (uint)fVar12) + fVar10 + fVar9)
          break;
        }
      }
      uVar6 = uVar6 - 1;
    }
    bVar7 = val < 0x10;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

static bool isBilinearCompareValid (const Sampler::CompareMode	compareMode,
									const TexComparePrecision&	prec,
									const Vec4&					depths,
									const Vec2&					xBounds,
									const Vec2&					yBounds,
									const float					cmpReference,
									const float					result,
									const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isBilinearPCFCompareValid(compareMode, prec, depths, xBounds, yBounds, cmpReference, result, isFixedPointDepth);
	else
		return isBilinearAnyCompareValid(compareMode, prec, depths, cmpReference, result, isFixedPointDepth);
}